

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,Script *locking_script,DescriptorScriptType script_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *address_prefixes)

{
  undefined8 uVar1;
  string *message;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *this_00;
  CfdError error_code;
  CfdException *this_01;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_28;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *address_prefixes_local;
  Script *pSStack_18;
  DescriptorScriptType script_type_local;
  Script *locking_script_local;
  DescriptorScriptReference *this_local;
  
  this->script_type_ = script_type;
  local_28 = address_prefixes;
  address_prefixes_local._4_4_ = script_type;
  pSStack_18 = locking_script;
  locking_script_local = (Script *)this;
  Script::Script(&this->locking_script_,locking_script);
  this->is_script_ = false;
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_);
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  message = (string *)&this->child_script_;
  ::std::shared_ptr<cfd::core::DescriptorScriptReference>::shared_ptr
            ((shared_ptr<cfd::core::DescriptorScriptReference> *)message,(nullptr_t)0x0);
  this_00 = &this->keys_;
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  vector(this_00);
  error_code = (CfdError)((ulong)this_00 >> 0x20);
  this_01 = (CfdException *)&this->addr_prefixes_;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             this_01,local_28);
  if ((address_prefixes_local._4_4_ != kDescriptorScriptRaw) &&
     (address_prefixes_local._4_4_ != kDescriptorScriptMiniscript)) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x1cd;
    local_50.funcname = "DescriptorScriptReference";
    logger::warn<>(&local_50,"If it is not a raw type, key or script is required.");
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_70,"If it is not a raw type, key or script is required.",&local_71);
    CfdException::CfdException(this_01,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const Script& locking_script, DescriptorScriptType script_type,
    const std::vector<AddressFormatData>& address_prefixes)
    : script_type_(script_type),
      locking_script_(locking_script),
      is_script_(false),
      is_tapbranch_(false),
      addr_prefixes_(address_prefixes) {
  if ((script_type != DescriptorScriptType::kDescriptorScriptRaw) &&
      (script_type != DescriptorScriptType::kDescriptorScriptMiniscript)) {
    warn(
        CFD_LOG_SOURCE, "If it is not a raw type, key or script is required.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "If it is not a raw type, key or script is required.");
  }
}